

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall QPDFObjectHandle::rotatePage(QPDFObjectHandle *this,int angle,bool relative)

{
  int iVar1;
  bool bVar2;
  runtime_error *this_00;
  size_type sVar3;
  QPDFObjectHandle local_158;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118 [32];
  QPDFObjectHandle local_f8;
  allocator<char> local_e1;
  string local_e0 [32];
  QPDFObjectHandle local_c0;
  allocator<char> local_a9;
  string local_a8 [32];
  QPDFObjectHandle local_88;
  QPDFObjGen local_78;
  undefined1 local_70 [8];
  set visited;
  QPDFObjectHandle cur_obj;
  int local_28;
  int old_angle;
  int new_angle;
  bool relative_local;
  int angle_local;
  QPDFObjectHandle *this_local;
  
  if (angle % 0x5a != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"QPDF::rotatePage called with an angle that is not a multiple of 90");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_28 = angle;
  if (relative) {
    cur_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 0;
    QPDFObjectHandle((QPDFObjectHandle *)
                     &visited.
                      super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t
                      ._M_impl.super__Rb_tree_header._M_node_count,this);
    QPDFObjGen::set::set((set *)local_70);
    while( true ) {
      local_78 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                           ((BaseHandle *)
                            &visited.
                             super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                             ._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar2 = QPDFObjGen::set::add((set *)local_70,local_78);
      if (!bVar2) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_a8,"/Rotate",&local_a9);
      getKey(&local_88,
             (string *)
             &visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t
              ._M_impl.super__Rb_tree_header._M_node_count);
      bVar2 = getValueAsInt(&local_88,
                            (int *)((long)&cur_obj.super_BaseHandle.obj.
                                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi + 4));
      ~QPDFObjectHandle(&local_88);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator(&local_a9);
      if (bVar2) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_e0,"/Parent",&local_e1);
      getKey(&local_c0,
             (string *)
             &visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t
              ._M_impl.super__Rb_tree_header._M_node_count);
      bVar2 = isDictionary(&local_c0);
      ~QPDFObjectHandle(&local_c0);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator(&local_e1);
      if (!bVar2) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_118,"/Parent",&local_119);
      getKey(&local_f8,
             (string *)
             &visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t
              ._M_impl.super__Rb_tree_header._M_node_count);
      operator=((QPDFObjectHandle *)
                &visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                 _M_t._M_impl.super__Rb_tree_header._M_node_count,&local_f8);
      ~QPDFObjectHandle(&local_f8);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator(&local_119);
    }
    sVar3 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::size
                      ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                       local_70);
    QTC::TC("qpdf","QPDFObjectHandle found old angle",(uint)(sVar3 < 2));
    if (cur_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ % 0x5a != 0) {
      cur_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = 0;
    }
    local_28 = cur_obj.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ +
               angle;
    QPDFObjGen::set::~set((set *)local_70);
    ~QPDFObjectHandle((QPDFObjectHandle *)
                      &visited.
                       super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                       _M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  iVar1 = (int)((ulong)((long)(local_28 + 0x168) * -0x49f49f49) >> 0x20) + 0x168 + local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"/Rotate",&local_141);
  newInteger(&local_158,(long)(local_28 + 0x168 + ((iVar1 >> 8) - (iVar1 >> 0x1f)) * -0x168));
  replaceKey(this,&local_140,&local_158);
  ~QPDFObjectHandle(&local_158);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  return;
}

Assistant:

void
QPDFObjectHandle::rotatePage(int angle, bool relative)
{
    if ((angle % 90) != 0) {
        throw std::runtime_error(
            "QPDF::rotatePage called with an angle that is not a multiple of 90");
    }
    int new_angle = angle;
    if (relative) {
        int old_angle = 0;
        QPDFObjectHandle cur_obj = *this;
        QPDFObjGen::set visited;
        while (visited.add(cur_obj)) {
            // Don't get stuck in an infinite loop
            if (cur_obj.getKey("/Rotate").getValueAsInt(old_angle)) {
                break;
            } else if (cur_obj.getKey("/Parent").isDictionary()) {
                cur_obj = cur_obj.getKey("/Parent");
            } else {
                break;
            }
        }
        QTC::TC("qpdf", "QPDFObjectHandle found old angle", visited.size() > 1 ? 0 : 1);
        if ((old_angle % 90) != 0) {
            old_angle = 0;
        }
        new_angle += old_angle;
    }
    new_angle = (new_angle + 360) % 360;
    // Make this explicit even with new_angle == 0 since /Rotate can be inherited.
    replaceKey("/Rotate", QPDFObjectHandle::newInteger(new_angle));
}